

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

char * llhttp_status_name(llhttp_status_t status)

{
  switch(status) {
  case HTTP_STATUS_BAD_REQUEST:
    return "BAD_REQUEST";
  case HTTP_STATUS_UNAUTHORIZED:
    return "UNAUTHORIZED";
  case HTTP_STATUS_PAYMENT_REQUIRED:
    return "PAYMENT_REQUIRED";
  case HTTP_STATUS_FORBIDDEN:
    return "FORBIDDEN";
  case HTTP_STATUS_NOT_FOUND:
    return "NOT_FOUND";
  case HTTP_STATUS_METHOD_NOT_ALLOWED:
    return "METHOD_NOT_ALLOWED";
  case HTTP_STATUS_NOT_ACCEPTABLE:
    return "NOT_ACCEPTABLE";
  case HTTP_STATUS_PROXY_AUTHENTICATION_REQUIRED:
    return "PROXY_AUTHENTICATION_REQUIRED";
  case HTTP_STATUS_REQUEST_TIMEOUT:
    return "REQUEST_TIMEOUT";
  case HTTP_STATUS_CONFLICT:
    return "CONFLICT";
  case HTTP_STATUS_GONE:
    return "GONE";
  case HTTP_STATUS_LENGTH_REQUIRED:
    return "LENGTH_REQUIRED";
  case HTTP_STATUS_PRECONDITION_FAILED:
    return "PRECONDITION_FAILED";
  case HTTP_STATUS_PAYLOAD_TOO_LARGE:
    return "PAYLOAD_TOO_LARGE";
  case HTTP_STATUS_URI_TOO_LONG:
    return "URI_TOO_LONG";
  case HTTP_STATUS_UNSUPPORTED_MEDIA_TYPE:
    return "UNSUPPORTED_MEDIA_TYPE";
  case HTTP_STATUS_RANGE_NOT_SATISFIABLE:
    return "RANGE_NOT_SATISFIABLE";
  case HTTP_STATUS_EXPECTATION_FAILED:
    return "EXPECTATION_FAILED";
  case HTTP_STATUS_IM_A_TEAPOT:
    return "IM_A_TEAPOT";
  case HTTP_STATUS_PAGE_EXPIRED:
    return "PAGE_EXPIRED";
  case HTTP_STATUS_ENHANCE_YOUR_CALM:
    return "ENHANCE_YOUR_CALM";
  case HTTP_STATUS_MISDIRECTED_REQUEST:
    return "MISDIRECTED_REQUEST";
  case HTTP_STATUS_UNPROCESSABLE_ENTITY:
    return "UNPROCESSABLE_ENTITY";
  case HTTP_STATUS_LOCKED:
    return "LOCKED";
  case HTTP_STATUS_FAILED_DEPENDENCY:
    return "FAILED_DEPENDENCY";
  case HTTP_STATUS_TOO_EARLY:
    return "TOO_EARLY";
  case HTTP_STATUS_UPGRADE_REQUIRED:
    return "UPGRADE_REQUIRED";
  case 0x1ab:
  case 0x1b0:
  case 0x1b1:
  case 0x1b2:
  case 0x1b3:
  case 0x1b4:
  case 0x1b5:
  case 0x1b6:
  case 0x1b7:
  case 0x1b9:
  case 0x1ba:
  case 0x1bb:
  case 0x1bd:
  case 0x1be:
  case 0x1bf:
  case 0x1c0:
  case 0x1c4:
  case 0x1c5:
  case 0x1c6:
  case 0x1c7:
  case 0x1c8:
  case 0x1c9:
  case 0x1ca:
  case 0x1cb:
  case 0x1cd:
  case 0x1ce:
  case 0x1d0:
  case 0x1d1:
  case 0x1d2:
  case 0x1d3:
  case 0x1d4:
  case 0x1d5:
  case 0x1d6:
  case 0x1d7:
  case 0x1d8:
  case 0x1d9:
  case 0x1da:
  case 0x1db:
  case 0x1dc:
  case 0x1dd:
  case 0x1de:
  case 0x1df:
  case 0x1e0:
  case 0x1e1:
  case 0x1e2:
  case 0x1e3:
  case 0x1e4:
  case 0x1e5:
  case 0x1e6:
  case 0x1e7:
  case 0x1e8:
  case 0x1e9:
  case 0x1ea:
  case 0x1eb:
  case 0x1ec:
  case 0x1ed:
  case 0x200:
  case 0x201:
  case 0x202:
  case 0x203:
  case 0x204:
  case 0x205:
  case 0x206:
  case 0x207:
  case 0x210:
  case 0x213:
  case 0x214:
  case 0x215:
  case 0x216:
  case 0x217:
  case 0x218:
  case 0x219:
  case 0x21a:
  case 0x21b:
  case 0x21c:
  case 0x21d:
  case 0x21e:
  case 0x21f:
  case 0x220:
  case 0x221:
  case 0x222:
  case 0x223:
  case 0x224:
  case 0x225:
  case 0x226:
  case 0x227:
  case 0x228:
  case 0x229:
  case 0x22a:
  case 0x22b:
  case 0x22c:
  case 0x22d:
  case 0x22e:
  case 0x22f:
  case 0x230:
    goto switchD_001033d0_caseD_1ab;
  case HTTP_STATUS_PRECONDITION_REQUIRED:
    return "PRECONDITION_REQUIRED";
  case HTTP_STATUS_TOO_MANY_REQUESTS:
    return "TOO_MANY_REQUESTS";
  case HTTP_STATUS_REQUEST_HEADER_FIELDS_TOO_LARGE_UNOFFICIAL:
    return "REQUEST_HEADER_FIELDS_TOO_LARGE_UNOFFICIAL";
  case HTTP_STATUS_REQUEST_HEADER_FIELDS_TOO_LARGE:
    return "REQUEST_HEADER_FIELDS_TOO_LARGE";
  case HTTP_STATUS_LOGIN_TIMEOUT:
    return "LOGIN_TIMEOUT";
  case HTTP_STATUS_NO_RESPONSE:
    return "NO_RESPONSE";
  case HTTP_STATUS_RETRY_WITH:
    return "RETRY_WITH";
  case HTTP_STATUS_BLOCKED_BY_PARENTAL_CONTROL:
    return "BLOCKED_BY_PARENTAL_CONTROL";
  case HTTP_STATUS_UNAVAILABLE_FOR_LEGAL_REASONS:
    return "UNAVAILABLE_FOR_LEGAL_REASONS";
  case HTTP_STATUS_CLIENT_CLOSED_LOAD_BALANCED_REQUEST:
    return "CLIENT_CLOSED_LOAD_BALANCED_REQUEST";
  case HTTP_STATUS_INVALID_X_FORWARDED_FOR:
    return "INVALID_X_FORWARDED_FOR";
  case HTTP_STATUS_REQUEST_HEADER_TOO_LARGE:
    return "REQUEST_HEADER_TOO_LARGE";
  case HTTP_STATUS_SSL_CERTIFICATE_ERROR:
    return "SSL_CERTIFICATE_ERROR";
  case HTTP_STATUS_SSL_CERTIFICATE_REQUIRED:
    return "SSL_CERTIFICATE_REQUIRED";
  case HTTP_STATUS_HTTP_REQUEST_SENT_TO_HTTPS_PORT:
    return "HTTP_REQUEST_SENT_TO_HTTPS_PORT";
  case HTTP_STATUS_INVALID_TOKEN:
    return "INVALID_TOKEN";
  case HTTP_STATUS_CLIENT_CLOSED_REQUEST:
    return "CLIENT_CLOSED_REQUEST";
  case HTTP_STATUS_INTERNAL_SERVER_ERROR:
    return "INTERNAL_SERVER_ERROR";
  case HTTP_STATUS_NOT_IMPLEMENTED:
    return "NOT_IMPLEMENTED";
  case HTTP_STATUS_BAD_GATEWAY:
    return "BAD_GATEWAY";
  case HTTP_STATUS_SERVICE_UNAVAILABLE:
    return "SERVICE_UNAVAILABLE";
  case HTTP_STATUS_GATEWAY_TIMEOUT:
    return "GATEWAY_TIMEOUT";
  case HTTP_STATUS_HTTP_VERSION_NOT_SUPPORTED:
    return "HTTP_VERSION_NOT_SUPPORTED";
  case HTTP_STATUS_VARIANT_ALSO_NEGOTIATES:
    return "VARIANT_ALSO_NEGOTIATES";
  case HTTP_STATUS_INSUFFICIENT_STORAGE:
    return "INSUFFICIENT_STORAGE";
  case HTTP_STATUS_LOOP_DETECTED:
    return "LOOP_DETECTED";
  case HTTP_STATUS_BANDWIDTH_LIMIT_EXCEEDED:
    return "BANDWIDTH_LIMIT_EXCEEDED";
  case HTTP_STATUS_NOT_EXTENDED:
    return "NOT_EXTENDED";
  case HTTP_STATUS_NETWORK_AUTHENTICATION_REQUIRED:
    return "NETWORK_AUTHENTICATION_REQUIRED";
  case HTTP_STATUS_WEB_SERVER_UNKNOWN_ERROR:
    return "WEB_SERVER_UNKNOWN_ERROR";
  case HTTP_STATUS_WEB_SERVER_IS_DOWN:
    return "WEB_SERVER_IS_DOWN";
  case HTTP_STATUS_CONNECTION_TIMEOUT:
    return "CONNECTION_TIMEOUT";
  case HTTP_STATUS_ORIGIN_IS_UNREACHABLE:
    return "ORIGIN_IS_UNREACHABLE";
  case HTTP_STATUS_TIMEOUT_OCCURED:
    return "TIMEOUT_OCCURED";
  case HTTP_STATUS_SSL_HANDSHAKE_FAILED:
    return "SSL_HANDSHAKE_FAILED";
  case HTTP_STATUS_INVALID_SSL_CERTIFICATE:
    return "INVALID_SSL_CERTIFICATE";
  case HTTP_STATUS_RAILGUN_ERROR:
    return "RAILGUN_ERROR";
  case HTTP_STATUS_SITE_IS_OVERLOADED:
    return "SITE_IS_OVERLOADED";
  case HTTP_STATUS_SITE_IS_FROZEN:
    return "SITE_IS_FROZEN";
  case HTTP_STATUS_IDENTITY_PROVIDER_AUTHENTICATION_ERROR:
    return "IDENTITY_PROVIDER_AUTHENTICATION_ERROR";
  default:
    switch(status) {
    case HTTP_STATUS_MISCELLANEOUS_WARNING:
      return "MISCELLANEOUS_WARNING";
    case HTTP_STATUS_OK:
      return "OK";
    case HTTP_STATUS_CREATED:
      return "CREATED";
    case HTTP_STATUS_ACCEPTED:
      return "ACCEPTED";
    case HTTP_STATUS_NON_AUTHORITATIVE_INFORMATION:
      return "NON_AUTHORITATIVE_INFORMATION";
    case HTTP_STATUS_NO_CONTENT:
      return "NO_CONTENT";
    case HTTP_STATUS_RESET_CONTENT:
      return "RESET_CONTENT";
    case HTTP_STATUS_PARTIAL_CONTENT:
      return "PARTIAL_CONTENT";
    case HTTP_STATUS_MULTI_STATUS:
      return "MULTI_STATUS";
    case HTTP_STATUS_ALREADY_REPORTED:
      return "ALREADY_REPORTED";
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd7:
    case 0xd8:
    case 0xd9:
    case 0xda:
    case 0xdb:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
    case 0xe0:
    case 0xe1:
      break;
    case HTTP_STATUS_TRANSFORMATION_APPLIED:
      return "TRANSFORMATION_APPLIED";
    case HTTP_STATUS_IM_USED:
      return "IM_USED";
    default:
      switch(status) {
      case HTTP_STATUS_MISCELLANEOUS_PERSISTENT_WARNING:
        return "MISCELLANEOUS_PERSISTENT_WARNING";
      case HTTP_STATUS_MULTIPLE_CHOICES:
        return "MULTIPLE_CHOICES";
      case HTTP_STATUS_MOVED_PERMANENTLY:
        return "MOVED_PERMANENTLY";
      case HTTP_STATUS_FOUND:
        return "FOUND";
      case HTTP_STATUS_SEE_OTHER:
        return "SEE_OTHER";
      case HTTP_STATUS_NOT_MODIFIED:
        return "NOT_MODIFIED";
      case HTTP_STATUS_USE_PROXY:
        return "USE_PROXY";
      case HTTP_STATUS_SWITCH_PROXY:
        return "SWITCH_PROXY";
      case HTTP_STATUS_TEMPORARY_REDIRECT:
        return "TEMPORARY_REDIRECT";
      case HTTP_STATUS_PERMANENT_REDIRECT:
        return "PERMANENT_REDIRECT";
      }
      switch(status) {
      case HTTP_STATUS_CONTINUE:
        return "CONTINUE";
      case HTTP_STATUS_SWITCHING_PROTOCOLS:
        return "SWITCHING_PROTOCOLS";
      case HTTP_STATUS_PROCESSING:
        return "PROCESSING";
      case HTTP_STATUS_EARLY_HINTS:
        return "EARLY_HINTS";
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
        break;
      case HTTP_STATUS_RESPONSE_IS_STALE:
        return "RESPONSE_IS_STALE";
      case HTTP_STATUS_REVALIDATION_FAILED:
        return "REVALIDATION_FAILED";
      case HTTP_STATUS_DISCONNECTED_OPERATION:
        return "DISCONNECTED_OPERATION";
      case HTTP_STATUS_HEURISTIC_EXPIRATION:
        return "HEURISTIC_EXPIRATION";
      default:
        if (status == HTTP_STATUS_NETWORK_READ_TIMEOUT) {
          return "NETWORK_READ_TIMEOUT";
        }
        if (status == HTTP_STATUS_NETWORK_CONNECT_TIMEOUT) {
          return "NETWORK_CONNECT_TIMEOUT";
        }
      }
    }
switchD_001033d0_caseD_1ab:
    abort();
  }
}

Assistant:

const char* llhttp_status_name(llhttp_status_t status) {
#define HTTP_STATUS_GEN(NUM, NAME, STRING) case HTTP_STATUS_##NAME: return #STRING;
  switch (status) {
    HTTP_STATUS_MAP(HTTP_STATUS_GEN)
    default: abort();
  }
#undef HTTP_STATUS_GEN
}